

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

Index __thiscall
Eigen::internal::CompressedStorage<double,_int>::searchLowerIndex
          (CompressedStorage<double,_int> *this,Index start,Index end,Index key)

{
  Index IVar1;
  Index mid;
  Index key_local;
  Index end_local;
  Index start_local;
  CompressedStorage<double,_int> *this_local;
  
  IVar1 = end;
  start_local = start;
  while (end_local = IVar1, start_local < end_local) {
    IVar1 = end_local + start_local >> 1;
    if (this->m_indices[IVar1] < key) {
      start_local = IVar1 + 1;
      IVar1 = end_local;
    }
  }
  return start_local;
}

Assistant:

inline Index searchLowerIndex(Index start, Index end, Index key) const
    {
      while(end>start)
      {
        Index mid = (end+start)>>1;
        if (m_indices[mid]<key)
          start = mid+1;
        else
          end = mid;
      }
      return start;
    }